

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O2

SortedVector * __thiscall
wasm::SortedVector::merge
          (SortedVector *__return_storage_ptr__,SortedVector *this,SortedVector *other)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             ((long)(other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) +
             ((long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2));
  puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  puVar4 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar8 = 0;
  uVar7 = 0;
  while ((uVar10 < uVar9 && ((ulong)uVar8 < (ulong)((long)puVar5 - (long)puVar4 >> 2)))) {
    uVar1 = puVar3[uVar10];
    uVar2 = puVar4[uVar8];
    if (uVar1 < uVar2) {
      puVar6[uVar7] = uVar1;
      uVar10 = uVar10 + 1;
    }
    else {
      if (uVar2 < uVar1) {
        puVar6[uVar7] = uVar2;
      }
      else {
        puVar6[uVar7] = uVar1;
        uVar10 = uVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    uVar7 = uVar7 + 1;
  }
  puVar4 = (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; uVar10 < uVar9; uVar10 = uVar10 + 1) {
    uVar11 = (ulong)uVar7;
    uVar7 = uVar7 + 1;
    puVar4[uVar11] = puVar3[uVar10];
  }
  puVar3 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar9 = (ulong)uVar7;
    if ((ulong)((long)puVar4 - (long)puVar3 >> 2) <= (ulong)uVar8) break;
    uVar7 = uVar7 + 1;
    puVar5[uVar9] = puVar3[uVar8];
    uVar8 = uVar8 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             uVar9);
  return __return_storage_ptr__;
}

Assistant:

SortedVector merge(const SortedVector& other) const {
    SortedVector ret;
    ret.resize(size() + other.size());
    Index i = 0, j = 0, t = 0;
    while (i < size() && j < other.size()) {
      auto left = (*this)[i];
      auto right = other[j];
      if (left < right) {
        ret[t++] = left;
        i++;
      } else if (left > right) {
        ret[t++] = right;
        j++;
      } else {
        ret[t++] = left;
        i++;
        j++;
      }
    }
    while (i < size()) {
      ret[t++] = (*this)[i];
      i++;
    }
    while (j < other.size()) {
      ret[t++] = other[j];
      j++;
    }
    ret.resize(t);
    return ret;
  }